

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
Arithmetic_BinaryOperations_Test::~Arithmetic_BinaryOperations_Test
          (Arithmetic_BinaryOperations_Test *this)

{
  Arithmetic_BinaryOperations_Test *this_local;
  
  ~Arithmetic_BinaryOperations_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arithmetic, BinaryOperations) {
	MockParser mock(
		"let a = 3\n"
		"let b = a + 3\n"
		"let c = a * 10\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_ADD_LN, 1, 0);
	INS(BC_MUL_LN, 2, 0, 1);
	INS(BC_RET, 0, 0, 0);
}